

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::GatherBase::TestCompute(GatherBase *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint program;
  GLuint shader;
  GLint location;
  int iVar2;
  undefined4 extraout_var;
  bool *compile_error;
  GLuint m_buffer;
  GLfloat local_70;
  GLfloat GStack_6c;
  long local_68;
  undefined8 local_50;
  undefined1 local_40 [12];
  GLfloat local_34;
  undefined1 local_30 [8];
  GLfloat local_28;
  long lVar3;
  
  (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1d])(&local_70,this);
  this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  if (local_68 != 0) {
    shader = glu::CallLogWrapper::glCreateShader(this_00,0x91b9);
    glu::CallLogWrapper::glAttachShader(this_00,program,shader);
    glu::CallLogWrapper::glDeleteShader(this_00,shader);
    local_50._4_4_ = GStack_6c;
    glu::CallLogWrapper::glShaderSource(this_00,shader,1,(GLchar **)&local_50,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,shader);
  }
  this->program = program;
  std::__cxx11::string::~string((string *)&local_70);
  glu::CallLogWrapper::glLinkProgram(this_00,this->program);
  bVar1 = TGBase::CheckProgram(&this->super_TGBase,this->program,compile_error);
  if (bVar1) {
    glu::CallLogWrapper::glUseProgram(this_00,this->program);
    location = glu::CallLogWrapper::glGetUniformLocation(this_00,this->program,"cs_in");
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x23])(&local_70,this);
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x23])(&local_50,this);
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x23])(local_30,this);
    (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x23])(local_40,this);
    glu::CallLogWrapper::glUniform4f(this_00,location,local_70,local_50._4_4_,local_28,local_34);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&m_buffer);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,m_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,m_buffer);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    iVar2 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x26])(this);
    lVar3 = CONCAT44(extraout_var,iVar2);
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    glu::CallLogWrapper::glDeleteBuffers(this_00,1,&m_buffer);
  }
  else {
    lVar3 = -1;
  }
  return lVar3;
}

Assistant:

virtual long TestCompute()
	{
		GLuint m_buffer;

		program = CreateComputeProgram(ComputeShader());
		glLinkProgram(program);
		if (!CheckProgram(program))
			return ERROR;
		glUseProgram(program);

		glUniform4f(glGetUniformLocation(program, "cs_in"), BufferData().x(), BufferData().y(), BufferData().z(),
					BufferData().w());

		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(Vec4), NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glDispatchCompute(1, 1, 1);

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		long error = VerifyCompute();
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		glDeleteBuffers(1, &m_buffer);

		return error;
	}